

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaGlitch.c
# Opt level: O0

void Gli_ManGlitching(Gli_Man_t *p)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  bool bVar4;
  int local_28;
  int Handle;
  int k;
  int i;
  Gli_Obj_t *pFanout;
  Gli_Obj_t *pThis;
  Gli_Man_t *p_local;
  
  Vec_IntClear(p->vAffected);
  for (Handle = 0; iVar2 = Vec_IntSize(p->vCisChanged), Handle < iVar2; Handle = Handle + 1) {
    iVar2 = Vec_IntEntry(p->vCisChanged,Handle);
    Vec_IntPush(p->vAffected,iVar2);
  }
  while (iVar2 = Vec_IntSize(p->vAffected), 0 < iVar2) {
    Vec_IntClear(p->vFrontier);
    Handle = 0;
    while( true ) {
      iVar2 = Vec_IntSize(p->vAffected);
      bVar4 = false;
      if (Handle < iVar2) {
        iVar2 = Vec_IntEntry(p->vAffected,Handle);
        pFanout = Gli_ManObj(p,iVar2);
        bVar4 = pFanout != (Gli_Obj_t *)0x0;
      }
      if (!bVar4) break;
      local_28 = 0;
      while( true ) {
        bVar4 = false;
        if (local_28 < (int)(*(uint *)pFanout >> 7)) {
          _k = Gli_ObjFanout(pFanout,local_28);
          bVar4 = _k != (Gli_Obj_t *)0x0;
        }
        if (!bVar4) break;
        iVar2 = Gli_ObjIsCo(_k);
        if ((iVar2 == 0) && ((*(uint *)_k >> 3 & 1) == 0)) {
          *(uint *)_k = *(uint *)_k & 0xfffffff7 | 8;
          Vec_IntPush(p->vFrontier,_k->Handle);
        }
        local_28 = local_28 + 1;
      }
      Handle = Handle + 1;
    }
    Vec_IntClear(p->vAffected);
    Handle = 0;
    while( true ) {
      iVar2 = Vec_IntSize(p->vFrontier);
      bVar4 = false;
      if (Handle < iVar2) {
        iVar2 = Vec_IntEntry(p->vFrontier,Handle);
        pFanout = Gli_ManObj(p,iVar2);
        bVar4 = pFanout != (Gli_Obj_t *)0x0;
      }
      if (!bVar4) break;
      *(uint *)pFanout = *(uint *)pFanout & 0xfffffff7;
      uVar1 = *(uint *)pFanout;
      uVar3 = Gli_NodeComputeValue2(pFanout);
      if ((uVar1 >> 2 & 1) != uVar3) {
        *(uint *)pFanout = *(uint *)pFanout & 0xfffffffb | (*(uint *)pFanout >> 2 & 1 ^ 1) << 2;
        (pFanout->field_10).iFanout = (pFanout->field_10).iFanout + 1;
        Vec_IntPush(p->vAffected,pFanout->Handle);
      }
      Handle = Handle + 1;
    }
  }
  return;
}

Assistant:

void Gli_ManGlitching( Gli_Man_t * p )
{
    Gli_Obj_t * pThis, * pFanout;//, * pOther = Gli_ManObj(p, 41);
    int i, k, Handle;
//    Gli_ManForEachObj( p, pThis, i )
//        assert( pThis->fMark == 0 );
    // start the array of affected nodes
    Vec_IntClear( p->vAffected );
    Vec_IntForEachEntry( p->vCisChanged, Handle, i )
        Vec_IntPush( p->vAffected, Handle );
    // iteration propagation
    while ( Vec_IntSize(p->vAffected) > 0 )
    {
        // compute the frontier
        Vec_IntClear( p->vFrontier );
        Gli_ManForEachEntry( p->vAffected, p, pThis, i )
        {
            Gli_ObjForEachFanout( pThis, pFanout, k )
            {
                if ( Gli_ObjIsCo(pFanout) )
                    continue;
                if ( pFanout->fMark )
                    continue;
                pFanout->fMark = 1;
                Vec_IntPush( p->vFrontier, pFanout->Handle );
            }
        }
        // compute the next set of affected nodes
        Vec_IntClear( p->vAffected );
        Gli_ManForEachEntry( p->vFrontier, p, pThis, i )
        {
            pThis->fMark = 0;
            if ( ((int)pThis->fPhase2) == Gli_NodeComputeValue2(pThis) )
                continue;
            pThis->fPhase2 ^= 1;
            pThis->nGlitches++;
            Vec_IntPush( p->vAffected, pThis->Handle );
        }
    }
}